

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

QPointF __thiscall QScroller::pixelPerMeter(QScroller *this)

{
  QPointF *pQVar1;
  long lVar2;
  undefined1 auVar3 [16];
  QPointF QVar4;
  bool bVar5;
  QGraphicsObject *pQVar6;
  QGraphicsScene *this_00;
  long lVar7;
  QTransform *pQVar8;
  qreal *pqVar9;
  QTransform *pQVar10;
  long in_FS_OFFSET;
  byte bVar11;
  Data *pDVar12;
  qsizetype qVar13;
  undefined1 *puVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  QPointF QVar17;
  QGraphicsView **in_XMM1_Qa;
  QArrayDataPointer<QGraphicsView_*> local_d8;
  QTransform tr;
  QTransform viewtr;
  
  bVar11 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d_ptr->pixelPerMeter;
  QVar17 = *pQVar1;
  QVar4 = *pQVar1;
  pQVar6 = QtPrivate::qobject_cast_helper<QGraphicsObject*,QObject>(this->d_ptr->target);
  if (pQVar6 != (QGraphicsObject *)0x0) {
    pqVar9 = (qreal *)&DAT_0067d478;
    pQVar8 = &viewtr;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar9;
      pqVar9 = pqVar9 + (ulong)bVar11 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    pqVar9 = (qreal *)&DAT_0067d988;
    pQVar8 = &viewtr;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar9;
      pqVar9 = pqVar9 + (ulong)bVar11 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    viewtr._72_2_ = 0xa800;
    this_00 = (QGraphicsScene *)QGraphicsItem::scene(&pQVar6->super_QGraphicsItem);
    if (this_00 != (QGraphicsScene *)0x0) {
      local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      QGraphicsScene::views((QList<QGraphicsView_*> *)&local_d8,this_00);
      if ((undefined1 *)local_d8.size != (undefined1 *)0x0) {
        QGraphicsView::viewportTransform(&tr,(QGraphicsView *)*local_d8.ptr);
        pQVar8 = &tr;
        pQVar10 = &viewtr;
        for (lVar7 = 0x4a; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined1 *)pQVar10->m_matrix[0] = *(undefined1 *)pQVar8->m_matrix[0];
          pQVar8 = (QTransform *)((long)pQVar8 + (ulong)bVar11 * -2 + 1);
          pQVar10 = (QTransform *)((long)pQVar10 + (ulong)bVar11 * -2 + 1);
        }
      }
      QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer(&local_d8);
    }
    pqVar9 = (qreal *)&DAT_0067d478;
    pQVar8 = &tr;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar9;
      pqVar9 = pqVar9 + (ulong)bVar11 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    QGraphicsItem::deviceTransform(&tr,&pQVar6->super_QGraphicsItem,&viewtr);
    bVar5 = QTransform::isScaling(&tr);
    if (bVar5) {
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (QGraphicsView **)0x0;
      pDVar12 = (Data *)QTransform::map((QPointF *)&tr);
      local_d8.d = (Data *)0x3ff0000000000000;
      local_d8.ptr = (QGraphicsView **)0x0;
      qVar13 = QTransform::map((QPointF *)&tr);
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (QGraphicsView **)0x3ff0000000000000;
      puVar14 = (undefined1 *)QTransform::map((QPointF *)&tr);
      local_d8.d = pDVar12;
      local_d8.size = qVar13;
      uVar15 = QLineF::length();
      local_d8.d = pDVar12;
      local_d8.ptr = in_XMM1_Qa;
      local_d8.size = (qsizetype)puVar14;
      uVar16 = QLineF::length();
      auVar3._8_8_ = uVar16;
      auVar3._0_8_ = uVar15;
      QVar17 = (QPointF)divpd((undefined1  [16])QVar4,auVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return QVar17;
}

Assistant:

QPointF QScroller::pixelPerMeter() const
{
    Q_D(const QScroller);
    QPointF ppm = d->pixelPerMeter;

#if QT_CONFIG(graphicsview)
    if (QGraphicsObject *go = qobject_cast<QGraphicsObject *>(d->target)) {
        QTransform viewtr;
        //TODO: the first view isn't really correct - maybe use an additional field in the prepare event?
        if (const auto *scene = go->scene()) {
            const auto views = scene->views();
            if (!views.isEmpty())
                viewtr = views.first()->viewportTransform();
        }
        QTransform tr = go->deviceTransform(viewtr);
        if (tr.isScaling()) {
            QPointF p0 = tr.map(QPointF(0, 0));
            QPointF px = tr.map(QPointF(1, 0));
            QPointF py = tr.map(QPointF(0, 1));
            ppm.rx() /= QLineF(p0, px).length();
            ppm.ry() /= QLineF(p0, py).length();
        }
    }
#endif // QT_CONFIG(graphicsview)
    return ppm;
}